

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O2

monst * restmonchn(memfile *mf,level *lev,boolean ghostly)

{
  monst *pmVar1;
  boolean bVar2;
  int32_t iVar3;
  int mndx;
  uint uVar4;
  monst *shkp;
  obj *poVar5;
  monst *pmVar6;
  obj *poVar7;
  monst *pmVar8;
  bool bVar9;
  
  mfmagic_check(mf,0x4e48434d);
  iVar3 = mread32(mf);
  pmVar8 = (monst *)0x0;
  pmVar6 = (monst *)0x0;
  do {
    bVar9 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar9) {
      if ((pmVar8 != (monst *)0x0) && (pmVar6->nmon != (monst *)0x0)) {
        impossible("Restmonchn: error reading monchn.");
        pmVar6->nmon = (monst *)0x0;
      }
      return pmVar8;
    }
    shkp = restore_mon(mf);
    pmVar1 = shkp;
    if (pmVar8 != (monst *)0x0) {
      pmVar6->nmon = shkp;
      pmVar1 = pmVar8;
    }
    pmVar8 = pmVar1;
    shkp->dlevel = lev;
    uVar4 = flags.ident;
    if (ghostly != '\0') {
      flags.ident = flags.ident + 1;
      add_id_mapping(shkp->m_id,uVar4);
      shkp->m_id = uVar4;
      mndx = monsndx(shkp->data);
      bVar2 = propagate(mndx,'\x01',ghostly);
      if (bVar2 == '\0') {
        shkp->mhpmax = -100;
      }
    }
    poVar7 = (obj *)&shkp->minvent;
    if (shkp->minvent != (obj *)0x0) {
      poVar5 = restobjchn(mf,lev,ghostly,'\0');
      *(obj **)poVar7 = poVar5;
      for (; poVar5 != (obj *)0x0; poVar5 = poVar5->nobj) {
        (poVar5->v).v_ocarry = shkp;
      }
    }
    if (shkp->mw != (obj *)0x0) {
      do {
        poVar7 = poVar7->nobj;
        if (poVar7 == (obj *)0x0) {
          shkp->mw = (obj *)0x0;
          impossible("bad monster weapon restore");
          goto LAB_00225969;
        }
      } while ((poVar7->owornmask & 0x100) == 0);
      shkp->mw = poVar7;
    }
LAB_00225969:
    uVar4 = *(uint *)&shkp->field_0x60;
    if ((uVar4 >> 0x19 & 1) != 0) {
      restshk(shkp,ghostly);
      uVar4 = *(uint *)&shkp->field_0x60;
    }
    pmVar6 = shkp;
    if ((uVar4 >> 0x1c & 1) != 0) {
      restpriest(shkp,ghostly);
    }
  } while( true );
}

Assistant:

static struct monst *restmonchn(struct memfile *mf, struct level *lev, boolean ghostly)
{
	struct monst *mtmp, *mtmp2 = NULL;
	struct monst *first = NULL;
	struct obj *obj;
	unsigned int count, mndx;

	/* get the original base address */
	mfmagic_check(mf, MONCHAIN_MAGIC);
	count = mread32(mf);

	while (count--) {
	    mtmp = restore_mon(mf);
	    if (!first)
		first = mtmp;
	    else
		mtmp2->nmon = mtmp;
	    mtmp->dlevel = lev;
	    
	    if (ghostly) {
		unsigned nid = flags.ident++;
		add_id_mapping(mtmp->m_id, nid);
		mtmp->m_id = nid;

		mndx = monsndx(mtmp->data);
		if (propagate(mndx, TRUE, ghostly) == 0) {
		    /* cookie to trigger purge in getbones() */
		    mtmp->mhpmax = DEFUNCT_MONSTER;	
		}
	    }
	    
	    if (mtmp->minvent) {
		mtmp->minvent = restobjchn(mf, lev, ghostly, FALSE);
		/* restore monster back pointer */
		for (obj = mtmp->minvent; obj; obj = obj->nobj)
		    obj->ocarry = mtmp;
	    }
	    
	    if (mtmp->mw) {
		for (obj = mtmp->minvent; obj; obj = obj->nobj)
		    if (obj->owornmask & W_WEP) break;
		if (obj) mtmp->mw = obj;
		else {
		    MON_NOWEP(mtmp);
		    impossible("bad monster weapon restore");
		}
	    }

	    if (mtmp->isshk) restshk(mtmp, ghostly);
	    if (mtmp->ispriest) restpriest(mtmp, ghostly);

	    mtmp2 = mtmp;
	}
	if (first && mtmp2->nmon){
	    impossible("Restmonchn: error reading monchn.");
	    mtmp2->nmon = 0;
	}
	
	return first;
}